

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameStage.cpp
# Opt level: O0

void __thiscall GameOverStage::GameOverStage(GameOverStage *this)

{
  TextPrinter *this_00;
  pointer this_01;
  vec4 local_78;
  vec3 local_68;
  allocator<char> local_59;
  string local_58;
  unique_ptr<TextPrinter,std::default_delete<TextPrinter>> local_38 [8];
  GLFWwindow *local_30;
  GLFWwindow *window;
  uint local_20;
  int height;
  int width;
  GameOverStage *local_10;
  GameOverStage *this_local;
  
  local_10 = this;
  GameStage::GameStage(&this->super_GameStage);
  (this->super_GameStage)._vptr_GameStage = (_func_int **)&PTR_renderFrame_0020f8a8;
  std::unique_ptr<TextPrinter,std::default_delete<TextPrinter>>::
  unique_ptr<std::default_delete<TextPrinter>,void>
            ((unique_ptr<TextPrinter,std::default_delete<TextPrinter>> *)&this->m_text);
  glClearColor(0x3f800000,0x3f333333,0x3ecccccd);
  local_30 = glfwGetCurrentContext();
  glfwGetFramebufferSize(local_30,(int *)&local_20,(int *)((long)&window + 4));
  this_00 = (TextPrinter *)operator_new(0x90);
  TextPrinter::TextPrinter(this_00,local_20,window._4_4_);
  std::unique_ptr<TextPrinter,std::default_delete<TextPrinter>>::
  unique_ptr<std::default_delete<TextPrinter>,void>(local_38,this_00);
  std::unique_ptr<TextPrinter,_std::default_delete<TextPrinter>_>::operator=
            (&this->m_text,(unique_ptr<TextPrinter,_std::default_delete<TextPrinter>_> *)local_38);
  std::unique_ptr<TextPrinter,_std::default_delete<TextPrinter>_>::~unique_ptr
            ((unique_ptr<TextPrinter,_std::default_delete<TextPrinter>_> *)local_38);
  this_01 = std::unique_ptr<TextPrinter,_std::default_delete<TextPrinter>_>::operator->
                      (&this->m_text);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"GAME OVER!",&local_59);
  glm::vec<3,float,(glm::qualifier)0>::vec<int,int,int>
            ((vec<3,float,(glm::qualifier)0> *)&local_68,1,0,0);
  glm::vec<4,float,(glm::qualifier)0>::vec<int,int,int,int>
            ((vec<4,float,(glm::qualifier)0> *)&local_78,1,1,1,0);
  TextPrinter::printText(this_01,&local_58,0,3,10,&local_68,&local_78,0);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

GameOverStage::GameOverStage()
{
  glClearColor(1, 0.7, 0.4, 1);
  int width, height;
  GLFWwindow * window = glfwGetCurrentContext();
  glfwGetFramebufferSize(window, &width, &height);
  m_text = std::unique_ptr<TextPrinter>(new TextPrinter(width, height));
  m_text->printText("GAME OVER!", 0, 3, 10, glm::vec3(1, 0, 0));
}